

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packets.c
# Opt level: O3

int rtr_send_serial_query(rtr_socket *rtr_socket)

{
  int iVar1;
  int iVar2;
  long in_FS_OFFSET;
  pdu_serial_query pdu;
  undefined1 local_2c;
  undefined1 local_2b;
  undefined2 local_2a;
  undefined4 local_28;
  uint32_t local_24;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_2c = (undefined1)rtr_socket->version;
  local_2b = 1;
  local_2a = (undefined2)rtr_socket->session_id;
  local_28 = 0xc;
  local_24 = rtr_socket->serial_number;
  iVar2 = 0;
  lrtr_dbg("RTR Socket: sending serial query, SN: %u");
  iVar1 = rtr_send_pdu(rtr_socket,&local_2c,0xc);
  if (iVar1 != 0) {
    rtr_change_socket_state(rtr_socket,RTR_ERROR_TRANSPORT);
    iVar2 = -1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

int rtr_send_serial_query(struct rtr_socket *rtr_socket)
{
	struct pdu_serial_query pdu;

	pdu.ver = rtr_socket->version;
	pdu.type = SERIAL_QUERY;
	pdu.session_id = rtr_socket->session_id;
	pdu.len = sizeof(pdu);
	pdu.sn = rtr_socket->serial_number;

	RTR_DBG("sending serial query, SN: %u", rtr_socket->serial_number);
	if (rtr_send_pdu(rtr_socket, &pdu, sizeof(pdu)) != RTR_SUCCESS) {
		rtr_change_socket_state(rtr_socket, RTR_ERROR_TRANSPORT);
		return RTR_ERROR;
	}
	return RTR_SUCCESS;
}